

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O1

_Bool Curl_clone_ssl_config(ssl_config_data *source,ssl_config_data *dest)

{
  _Bool _Var1;
  char *pcVar2;
  
  dest->sessionid = source->sessionid;
  dest->verifyhost = source->verifyhost;
  dest->verifypeer = source->verifypeer;
  dest->version = source->version;
  if (source->CAfile == (char *)0x0) {
    dest->CAfile = (char *)0x0;
LAB_004e2def:
    if (source->CApath == (char *)0x0) {
      dest->CApath = (char *)0x0;
    }
    else {
      pcVar2 = (*Curl_cstrdup)(source->CApath);
      dest->CApath = pcVar2;
      if (pcVar2 == (char *)0x0) goto LAB_004e2e79;
    }
    if (source->cipher_list == (char *)0x0) {
      dest->cipher_list = (char *)0x0;
    }
    else {
      pcVar2 = (*Curl_cstrdup)(source->cipher_list);
      dest->cipher_list = pcVar2;
      if (pcVar2 == (char *)0x0) goto LAB_004e2e79;
    }
    if (source->egdsocket == (char *)0x0) {
      dest->egdsocket = (char *)0x0;
    }
    else {
      pcVar2 = (*Curl_cstrdup)(source->egdsocket);
      dest->egdsocket = pcVar2;
      if (pcVar2 == (char *)0x0) goto LAB_004e2e79;
    }
    if (source->random_file == (char *)0x0) {
      dest->random_file = (char *)0x0;
    }
    else {
      pcVar2 = (*Curl_cstrdup)(source->random_file);
      dest->random_file = pcVar2;
      if (pcVar2 == (char *)0x0) goto LAB_004e2e79;
    }
    _Var1 = true;
  }
  else {
    pcVar2 = (*Curl_cstrdup)(source->CAfile);
    dest->CAfile = pcVar2;
    if (pcVar2 != (char *)0x0) goto LAB_004e2def;
LAB_004e2e79:
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

bool
Curl_clone_ssl_config(struct ssl_config_data *source,
                      struct ssl_config_data *dest)
{
  dest->sessionid = source->sessionid;
  dest->verifyhost = source->verifyhost;
  dest->verifypeer = source->verifypeer;
  dest->version = source->version;

  if(source->CAfile) {
    dest->CAfile = strdup(source->CAfile);
    if(!dest->CAfile)
      return FALSE;
  }
  else
    dest->CAfile = NULL;

  if(source->CApath) {
    dest->CApath = strdup(source->CApath);
    if(!dest->CApath)
      return FALSE;
  }
  else
    dest->CApath = NULL;

  if(source->cipher_list) {
    dest->cipher_list = strdup(source->cipher_list);
    if(!dest->cipher_list)
      return FALSE;
  }
  else
    dest->cipher_list = NULL;

  if(source->egdsocket) {
    dest->egdsocket = strdup(source->egdsocket);
    if(!dest->egdsocket)
      return FALSE;
  }
  else
    dest->egdsocket = NULL;

  if(source->random_file) {
    dest->random_file = strdup(source->random_file);
    if(!dest->random_file)
      return FALSE;
  }
  else
    dest->random_file = NULL;

  return TRUE;
}